

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O1

btVector3 __thiscall btSphereShape::localGetSupportingVertex(btSphereShape *this,btVector3 *vec)

{
  undefined1 auVar1 [16];
  float extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined1 auVar2 [16];
  float fVar3;
  uint uVar4;
  float fVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  btVector3 bVar9;
  float local_28;
  float fStack_24;
  
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0x11])();
  fVar8 = vec->m_floats[2];
  fVar5 = vec->m_floats[0];
  fVar7 = vec->m_floats[1];
  fVar3 = fVar8 * fVar8 + fVar5 * fVar5 + fVar7 * fVar7;
  uVar6 = (uint)(fVar3 < 1.4210855e-14);
  uVar4 = (int)(uVar6 << 0x1f) >> 0x1f;
  uVar6 = (int)(uVar6 << 0x1f) >> 0x1f;
  fVar5 = (float)(uVar4 & 0xbf800000 | ~uVar4 & (uint)fVar5);
  fVar7 = (float)(uVar6 & 0xbf800000 | ~uVar6 & (uint)fVar7);
  if (fVar3 < 1.4210855e-14) {
    fVar8 = -1.0;
  }
  fVar3 = fVar8 * fVar8 + fVar5 * fVar5 + fVar7 * fVar7;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  local_28 = (float)extraout_XMM0_Qa;
  fStack_24 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  bVar9.m_floats[1] = fStack_24 + extraout_XMM0_Da * fVar3 * fVar7;
  bVar9.m_floats[0] = local_28 + extraout_XMM0_Da * fVar3 * fVar5;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar2._4_12_ = auVar1._4_12_;
  auVar2._0_4_ = (float)in_XMM1_Qa + fVar3 * fVar8 * extraout_XMM0_Da;
  bVar9.m_floats._8_8_ = auVar2._0_8_;
  return (btVector3)bVar9.m_floats;
}

Assistant:

btVector3	btSphereShape::localGetSupportingVertex(const btVector3& vec)const
{
	btVector3 supVertex;
	supVertex = localGetSupportingVertexWithoutMargin(vec);

	btVector3 vecnorm = vec;
	if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
	{
		vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
	} 
	vecnorm.normalize();
	supVertex+= getMargin() * vecnorm;
	return supVertex;
}